

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall libtorrent::bdecode_node::operator=(bdecode_node *this,bdecode_node *n)

{
  bool bVar1;
  reference pvVar2;
  bdecode_node *n_local;
  bdecode_node *this_local;
  
  if (n != this) {
    ::std::vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    operator=(&this->m_tokens,&n->m_tokens);
    this->m_root_tokens = n->m_root_tokens;
    this->m_buffer = n->m_buffer;
    this->m_buffer_size = n->m_buffer_size;
    this->m_token_idx = n->m_token_idx;
    this->m_last_index = n->m_last_index;
    this->m_last_token = n->m_last_token;
    this->m_size = n->m_size;
    bVar1 = ::std::
            vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::empty(&this->m_tokens);
    if (!bVar1) {
      pvVar2 = ::std::
               vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
               ::operator[](&this->m_tokens,0);
      this->m_root_tokens = pvVar2;
    }
  }
  return this;
}

Assistant:

bdecode_node& bdecode_node::operator=(bdecode_node const& n) &
	{
		if (&n == this) return *this;
		m_tokens = n.m_tokens;
		m_root_tokens = n.m_root_tokens;
		m_buffer = n.m_buffer;
		m_buffer_size = n.m_buffer_size;
		m_token_idx = n.m_token_idx;
		m_last_index = n.m_last_index;
		m_last_token = n.m_last_token;
		m_size = n.m_size;
		if (!m_tokens.empty())
		{
			// if this is a root, make the token pointer
			// point to our storage
			m_root_tokens = &m_tokens[0];
		}
		return *this;
	}